

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O2

bool __thiscall S2Polyline::FindValidationError(S2Polyline *this,S2Error *error)

{
  Code code;
  bool bVar1;
  int iVar2;
  S2Point *pSVar3;
  BasicVector<Vector3,_double,_3UL> *pBVar4;
  char *format;
  uint uVar5;
  uint k;
  D local_48;
  
  for (uVar5 = 0; iVar2 = this->num_vertices_, (int)uVar5 < iVar2; uVar5 = uVar5 + 1) {
    pSVar3 = vertex(this,uVar5);
    bVar1 = S2::IsUnitLength(pSVar3);
    if (!bVar1) {
      S2Error::Init(error,NOT_UNIT_LENGTH,"Vertex %d is not unit length",(ulong)uVar5);
      return true;
    }
  }
  uVar5 = 1;
  while( true ) {
    if (iVar2 <= (int)uVar5) {
      return false;
    }
    k = uVar5 - 1;
    pBVar4 = (BasicVector<Vector3,_double,_3UL> *)vertex(this,k);
    pSVar3 = vertex(this,uVar5);
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      (pBVar4,pSVar3);
    if (bVar1) break;
    pBVar4 = (BasicVector<Vector3,_double,_3UL> *)vertex(this,k);
    pSVar3 = vertex(this,uVar5);
    local_48.c_[2] = -pSVar3->c_[2];
    local_48.c_[0]._0_4_ = *(undefined4 *)pSVar3->c_;
    local_48.c_[1]._0_4_ = *(undefined4 *)(pSVar3->c_ + 1);
    local_48.c_[0]._4_4_ = *(uint *)((long)pSVar3->c_ + 4) ^ 0x80000000;
    local_48.c_[1]._4_4_ = *(uint *)((long)pSVar3->c_ + 0xc) ^ 0x80000000;
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      (pBVar4,&local_48);
    if (bVar1) {
      format = "Vertices %d and %d are antipodal";
      code = ANTIPODAL_VERTICES;
      goto LAB_0024ac92;
    }
    uVar5 = uVar5 + 1;
    iVar2 = this->num_vertices_;
  }
  format = "Vertices %d and %d are identical";
  code = DUPLICATE_VERTICES;
LAB_0024ac92:
  S2Error::Init(error,code,format,(ulong)k,(ulong)uVar5);
  return true;
}

Assistant:

bool S2Polyline::FindValidationError(S2Error* error) const {
  // All vertices must be unit length.
  for (int i = 0; i < num_vertices(); ++i) {
    if (!S2::IsUnitLength(vertex(i))) {
      error->Init(S2Error::NOT_UNIT_LENGTH, "Vertex %d is not unit length", i);
      return true;
    }
  }
  // Adjacent vertices must not be identical or antipodal.
  for (int i = 1; i < num_vertices(); ++i) {
    if (vertex(i - 1) == vertex(i)) {
      error->Init(S2Error::DUPLICATE_VERTICES,
                  "Vertices %d and %d are identical", i - 1, i);
      return true;
    }
    if (vertex(i - 1) == -vertex(i)) {
      error->Init(S2Error::ANTIPODAL_VERTICES,
                  "Vertices %d and %d are antipodal", i - 1, i);
      return true;
    }
  }
  return false;
}